

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

void lj_ctype_addname(CTState *cts,CType *ct,CTypeID id)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t h;
  CTypeID id_local;
  CType *ct_local;
  CTState *cts_local;
  
  uVar1 = (int)(ct->name).gcptr64 + 0xfb3ee249;
  uVar2 = uVar1 * 0x4000 | uVar1 >> 0x12;
  uVar3 = (uVar1 ^ (uint)(ct->name).gcptr64) - uVar2;
  uVar1 = (uVar3 ^ (uVar2 << 5 | uVar1 * 0x4000 >> 0x1b)) - (uVar3 >> 0x13) & 0x7f;
  ct->next = cts->hash[uVar1];
  cts->hash[uVar1] = (CTypeID1)id;
  return;
}

Assistant:

void lj_ctype_addname(CTState *cts, CType *ct, CTypeID id)
{
  uint32_t h = ct_hashname(gcref(ct->name));
  ct->next = cts->hash[h];
  cts->hash[h] = (CTypeID1)id;
}